

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.hpp
# Opt level: O2

int xercesc_4_0::XMLDateTime::getRetVal(int c1,int c2)

{
  int iVar1;
  
  iVar1 = 2;
  if (((c2 != 1 || c1 != -1) && (c2 != -1 || c1 != 1)) && (iVar1 = c2, c1 != 2)) {
    iVar1 = c1;
  }
  return iVar1;
}

Assistant:

inline int XMLDateTime::getRetVal(int c1, int c2)
{
    if ((c1 == LESS_THAN    && c2 == GREATER_THAN) ||
        (c1 == GREATER_THAN && c2 == LESS_THAN)      )
    {
        return INDETERMINATE;
    }

    return ( c1 != INDETERMINATE ) ? c1 : c2;
}